

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_async_policy::get_async
          (_async_policy *this,io_service *io_srv,service *srv)

{
  cppcms_error *this_00;
  long in_RCX;
  allocator local_39;
  string local_38;
  
  if (*(long *)(io_srv + 0x18) == 0) {
    if (in_RCX == 0) {
      (this->super__policy)._vptr__policy = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(long *)io_srv + 0x28))(this);
    }
  }
  else {
    if (*(service **)(io_srv + 0x20) != srv) {
      this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_38,
                 "given booster::aio::io_service isn\'t main event loop io_service",&local_39);
      cppcms_error::cppcms_error(this_00,&local_38);
      __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr
              ((intrusive_ptr<cppcms::application> *)this,
               (intrusive_ptr<cppcms::application> *)(io_srv + 0x18));
  }
  return (intrusive_ptr<cppcms::application>)(application *)this;
}

Assistant:

virtual booster::intrusive_ptr<application> get_async(booster::aio::io_service &io_srv,cppcms::service *srv = 0) 
	{

		if(app_) {
			if(&io_srv == io_srv_)
				return app_;
			else
				throw cppcms_error("given booster::aio::io_service isn't main event loop io_service");
		}
		if(!srv)
			return 0;
		return get(*srv);
	}